

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O3

void absl::base_internal::CallOnceImpl<absl::BadStatusOrAccess::InitWhat()const::__0>
               (Nonnull<std::atomic<uint32_t>_*> control,SchedulingMode scheduling_mode,
               anon_class_8_1_8991fb9c *fn)

{
  __int_type_conflict2 _Var1;
  long lVar2;
  Status *this;
  uint32_t uVar3;
  StatusToStringMode mode;
  undefined4 in_register_00000034;
  bool bVar4;
  undefined1 local_c0 [32];
  string local_a0;
  undefined8 local_80;
  char *local_78;
  AlphaNum local_50;
  
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  if ((int)_Var1 < 0x5a308d2) {
    if ((_Var1 != 0) && (_Var1 != 0xdd)) {
LAB_0012e653:
      raw_log_internal::RawLog(kFatal,"call_once.h",0xa2,"Unexpected value for control word: 0x%lx")
      ;
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/base/call_once.h"
                    ,0xa2,
                    "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = (lambda at /workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/status/statusor.cc:66:31), Args = <>]"
                   );
    }
  }
  else if ((_Var1 != 0x5a308d2) && (_Var1 != 0x65c2937b)) goto LAB_0012e653;
  mode = 0x65c2937b;
  LOCK();
  bVar4 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
  if (bVar4) {
    (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
  }
  UNLOCK();
  if (!bVar4) {
    mode = kDefault;
    uVar3 = SpinLockWait(control,3,
                         CallOnceImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/status/statusor.cc:66:31)>
                         ::trans,SCHEDULE_COOPERATIVE_AND_KERNEL);
    if (uVar3 != 0) {
      return;
    }
  }
  lVar2 = *(long *)CONCAT44(in_register_00000034,scheduling_mode);
  local_80 = 0x15;
  local_78 = "Bad StatusOr access: ";
  this = *(Status **)(lVar2 + 8);
  if (this == (Status *)0x1) {
    local_c0._16_2_ = 0x4b4f;
    local_c0._8_8_ = 2;
    local_c0[0x12] = '\0';
    local_c0._0_8_ = (AlphaNum *)(local_c0 + 0x10);
  }
  else {
    Status::ToStringSlow_abi_cxx11_((string *)local_c0,this,1,mode);
  }
  local_50.piece_._M_len = local_c0._8_8_;
  local_50.piece_._M_str = (char *)local_c0._0_8_;
  StrCat_abi_cxx11_(&local_a0,(absl *)&local_80,&local_50,(AlphaNum *)local_c0._0_8_);
  std::__cxx11::string::operator=((string *)(lVar2 + 0x18),(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((AlphaNum *)local_c0._0_8_ != (AlphaNum *)(local_c0 + 0x10)) {
    operator_delete((void *)local_c0._0_8_,
                    CONCAT53(local_c0._19_5_,CONCAT12(local_c0[0x12],local_c0._16_2_)) + 1);
  }
  LOCK();
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  (control->super___atomic_base<unsigned_int>)._M_i = 0xdd;
  UNLOCK();
  if (_Var1 == 0x5a308d2) {
    AbslInternalSpinLockWake(control,true);
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void CallOnceImpl(
    absl::Nonnull<std::atomic<uint32_t>*> control,
    base_internal::SchedulingMode scheduling_mode, Callable&& fn,
    Args&&... args) {
#ifndef NDEBUG
  {
    uint32_t old_control = control->load(std::memory_order_relaxed);
    if (old_control != kOnceInit &&
        old_control != kOnceRunning &&
        old_control != kOnceWaiter &&
        old_control != kOnceDone) {
      ABSL_RAW_LOG(FATAL, "Unexpected value for control word: 0x%lx",
                   static_cast<unsigned long>(old_control));  // NOLINT
    }
  }
#endif  // NDEBUG
  static const base_internal::SpinLockWaitTransition trans[] = {
      {kOnceInit, kOnceRunning, true},
      {kOnceRunning, kOnceWaiter, false},
      {kOnceDone, kOnceDone, true}};

  // Must do this before potentially modifying control word's state.
  base_internal::SchedulingHelper maybe_disable_scheduling(scheduling_mode);
  // Short circuit the simplest case to avoid procedure call overhead.
  // The base_internal::SpinLockWait() call returns either kOnceInit or
  // kOnceDone. If it returns kOnceDone, it must have loaded the control word
  // with std::memory_order_acquire and seen a value of kOnceDone.
  uint32_t old_control = kOnceInit;
  if (control->compare_exchange_strong(old_control, kOnceRunning,
                                       std::memory_order_relaxed) ||
      base_internal::SpinLockWait(control, ABSL_ARRAYSIZE(trans), trans,
                                  scheduling_mode) == kOnceInit) {
    base_internal::invoke(std::forward<Callable>(fn),
                          std::forward<Args>(args)...);
    old_control =
        control->exchange(base_internal::kOnceDone, std::memory_order_release);
    if (old_control == base_internal::kOnceWaiter) {
      base_internal::SpinLockWake(control, true);
    }
  }  // else *control is already kOnceDone
}